

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  bool bVar1;
  allocator<char> *__a;
  int local_fc;
  string local_f8 [24];
  undefined8 in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30;
  DeathTestImpl *local_10;
  DeathTestImpl *this_local;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_003b9588;
  local_10 = this;
  do {
    bVar1 = IsTrue(this->read_fd_ == -1);
    if (!bVar1) {
      __a = (allocator<char> *)&stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d0,"CHECK failed: File ",__a);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)__a);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)__a);
      local_fc = 0x191;
      StreamableToString<int>((string *)local_f8,&local_fc);
      std::operator+(in_stack_ffffffffffffff28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)__a);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)__a);
      DeathTestAbort(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  DeathTest::~DeathTest(&this->super_DeathTest);
  return;
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }